

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O1

void __thiscall QHybrid::Compute(QHybrid *this)

{
  Compute((QHybrid *)
          (&(this->super_QFunctionJAOHInterface).field_0x0 +
          *(long *)((long)this->super_QFunctionJAOHInterface + -0x20)));
  return;
}

Assistant:

void QHybrid::Compute()
{
    if(!_m_initialized)
        Initialize();

    // first compute the heuristic for the final time steps, as we
    // will use these values for the backup
    if(_m_QlastTimeSteps)
        _m_QlastTimeSteps->Compute();

    ComputeQ();
}